

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIPNode * PVIP_node_new_children(PVIPParserContext *parser,PVIP_node_type_t type)

{
  PVIPNode *pPVar1;
  
  pPVar1 = pvip_node_alloc(parser->pvip);
  pPVar1->type = PVIP_NODE_UNDEF;
  pPVar1->line_number = 0;
  (pPVar1->field_2).iv = 0;
  (pPVar1->field_2).children.nodes = (_PVIPNode **)0x0;
  if (type == PVIP_NODE_INT) {
    __assert_fail("type != PVIP_NODE_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xc9,"PVIPNode *PVIP_node_new_children(PVIPParserContext *, PVIP_node_type_t)");
  }
  if (type != PVIP_NODE_NUMBER) {
    pPVar1->type = type;
    (pPVar1->field_2).children.size = 0;
    (pPVar1->field_2).children.nodes = (_PVIPNode **)0x0;
    if (parser->line_number_stack_size != 0) {
      parser = (PVIPParserContext *)
               (parser->line_number_stack + (parser->line_number_stack_size - 1));
    }
    pPVar1->line_number = parser->line_number;
    return pPVar1;
  }
  __assert_fail("type != PVIP_NODE_NUMBER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,200,"PVIPNode *PVIP_node_new_children(PVIPParserContext *, PVIP_node_type_t)");
}

Assistant:

PVIPNode* PVIP_node_new_children(PVIPParserContext *parser, PVIP_node_type_t type) {
    PVIPNode *node = pvip_node_alloc(parser->pvip);
    memset(node, 0, sizeof(PVIPNode));
    assert(type != PVIP_NODE_NUMBER);
    assert(type != PVIP_NODE_INT);
    node->type = type;
    node->children.size  = 0;
    node->children.nodes = NULL;
    if (parser->line_number_stack_size > 0) {
        node->line_number = parser->line_number_stack[parser->line_number_stack_size-1];
    } else {
        node->line_number = parser->line_number;
    }
    return node;
}